

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::ApplyVertexToEffectSemanticMapping
          (ColladaLoader *this,Sampler *sampler,SemanticMappingTable *table)

{
  const_iterator cVar1;
  Logger *this_00;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>_>
          ::find(&(table->mMap)._M_t,&sampler->mUVChannel);
  if ((_Rb_tree_header *)cVar1._M_node != &(table->mMap)._M_t._M_impl.super__Rb_tree_header) {
    if (*(int *)&cVar1._M_node[2].field_0x4 != 4) {
      this_00 = DefaultLogger::get();
      Logger::error(this_00,"Collada: Unexpected effect input mapping");
    }
    sampler->mUVId = cVar1._M_node[2]._M_color;
  }
  return;
}

Assistant:

void ColladaLoader::ApplyVertexToEffectSemanticMapping(Collada::Sampler& sampler,

        const Collada::SemanticMappingTable& table) {
    std::map<std::string, Collada::InputSemanticMapEntry>::const_iterator it = table.mMap.find(sampler.mUVChannel);
    if (it != table.mMap.end()) {
        if (it->second.mType != Collada::IT_Texcoord) {
            ASSIMP_LOG_ERROR("Collada: Unexpected effect input mapping");
        }

        sampler.mUVId = it->second.mSet;
    }
}